

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

sqlite3_value * sqlite3VdbeGetBoundValue(Vdbe *v,int iVar,u8 aff)

{
  Mem *pMVar1;
  sqlite3_value *pRet;
  Mem *pMem;
  u8 aff_local;
  int iVar_local;
  Vdbe *v_local;
  
  if ((v == (Vdbe *)0x0) || (pMVar1 = v->aVar, (pMVar1[iVar + -1].flags & 1) != 0)) {
    v_local = (Vdbe *)0x0;
  }
  else {
    v_local = (Vdbe *)sqlite3ValueNew(v->db);
    if (v_local != (Vdbe *)0x0) {
      sqlite3VdbeMemCopy((Mem *)v_local,pMVar1 + (iVar + -1));
      sqlite3ValueApplyAffinity((sqlite3_value *)v_local,aff,'\x01');
    }
  }
  return (sqlite3_value *)v_local;
}

Assistant:

SQLITE_PRIVATE sqlite3_value *sqlite3VdbeGetBoundValue(Vdbe *v, int iVar, u8 aff){
  assert( iVar>0 );
  if( v ){
    Mem *pMem = &v->aVar[iVar-1];
    if( 0==(pMem->flags & MEM_Null) ){
      sqlite3_value *pRet = sqlite3ValueNew(v->db);
      if( pRet ){
        sqlite3VdbeMemCopy((Mem *)pRet, pMem);
        sqlite3ValueApplyAffinity(pRet, aff, SQLITE_UTF8);
      }
      return pRet;
    }
  }
  return 0;
}